

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-filenames.cc
# Opt level: O3

void __thiscall filenames_GetBasename_Test::TestBody(filenames_GetBasename_Test *this)

{
  char *in_RCX;
  string_view sVar1;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view filename_04;
  string_view filename_05;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view sv_03;
  string_view sv_04;
  string_view sv_05;
  string_view sv_06;
  string_view sv_07;
  
  sVar1._M_str = "/bar/dir/foo.txt";
  sVar1._M_len = 0x10;
  sVar1 = wabt::GetBasename(sVar1);
  sv._M_len = sVar1._M_str;
  sv._M_str = in_RCX;
  anon_unknown.dwarf_decc8::assert_string_view_eq
            ((anon_unknown_dwarf_decc8 *)0x1eb9fd,(char *)sVar1._M_len,sv);
  filename._M_str = "bar/dir/foo.txt";
  filename._M_len = 0xf;
  sVar1 = wabt::GetBasename(filename);
  sv_00._M_len = sVar1._M_str;
  sv_00._M_str = in_RCX;
  anon_unknown.dwarf_decc8::assert_string_view_eq
            ((anon_unknown_dwarf_decc8 *)0x1eb9fd,(char *)sVar1._M_len,sv_00);
  filename_00._M_str = "/foo.txt";
  filename_00._M_len = 8;
  sVar1 = wabt::GetBasename(filename_00);
  sv_01._M_len = sVar1._M_str;
  sv_01._M_str = in_RCX;
  anon_unknown.dwarf_decc8::assert_string_view_eq
            ((anon_unknown_dwarf_decc8 *)0x1eb9fd,(char *)sVar1._M_len,sv_01);
  filename_01._M_str = "\\bar\\dir\\foo.txt";
  filename_01._M_len = 0x10;
  sVar1 = wabt::GetBasename(filename_01);
  sv_02._M_len = sVar1._M_str;
  sv_02._M_str = in_RCX;
  anon_unknown.dwarf_decc8::assert_string_view_eq
            ((anon_unknown_dwarf_decc8 *)0x1eb9fd,(char *)sVar1._M_len,sv_02);
  filename_02._M_str = "bar\\dir\\foo.txt";
  filename_02._M_len = 0xf;
  sVar1 = wabt::GetBasename(filename_02);
  sv_03._M_len = sVar1._M_str;
  sv_03._M_str = in_RCX;
  anon_unknown.dwarf_decc8::assert_string_view_eq
            ((anon_unknown_dwarf_decc8 *)0x1eb9fd,(char *)sVar1._M_len,sv_03);
  filename_03._M_str = "\\foo.txt";
  filename_03._M_len = 8;
  sVar1 = wabt::GetBasename(filename_03);
  sv_04._M_len = sVar1._M_str;
  sv_04._M_str = in_RCX;
  anon_unknown.dwarf_decc8::assert_string_view_eq
            ((anon_unknown_dwarf_decc8 *)0x1eb9fd,(char *)sVar1._M_len,sv_04);
  filename_04._M_str = "foo.txt";
  filename_04._M_len = 7;
  sVar1 = wabt::GetBasename(filename_04);
  sv_05._M_len = sVar1._M_str;
  sv_05._M_str = in_RCX;
  anon_unknown.dwarf_decc8::assert_string_view_eq
            ((anon_unknown_dwarf_decc8 *)0x1eb9fd,(char *)sVar1._M_len,sv_05);
  filename_05._M_str = "foo";
  filename_05._M_len = 3;
  sVar1 = wabt::GetBasename(filename_05);
  sv_06._M_len = sVar1._M_str;
  sv_06._M_str = in_RCX;
  anon_unknown.dwarf_decc8::assert_string_view_eq
            ((anon_unknown_dwarf_decc8 *)0x1f87fa,(char *)sVar1._M_len,sv_06);
  sVar1 = wabt::GetBasename((string_view)(ZEXT816(0x1ee0e1) << 0x40));
  sv_07._M_len = sVar1._M_str;
  sv_07._M_str = in_RCX;
  anon_unknown.dwarf_decc8::assert_string_view_eq
            ((anon_unknown_dwarf_decc8 *)0x1ee0e1,(char *)sVar1._M_len,sv_07);
  return;
}

Assistant:

TEST(filenames, GetBasename) {
  assert_string_view_eq("foo.txt", GetBasename("/bar/dir/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("bar/dir/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("\\bar\\dir\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("bar\\dir\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("foo.txt"));
  assert_string_view_eq("foo", GetBasename("foo"));
  assert_string_view_eq("", GetBasename(""));
}